

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tokenizer.cpp
# Opt level: O2

void __thiscall Tokenizer::Tokenizer(Tokenizer *this,istream *stream)

{
  Mark *pMVar1;
  Token TStack_48;
  
  (this->stream_).is_ = stream;
  (this->stream_).mark_.line = 1;
  (this->stream_).mark_.column = 0;
  pMVar1 = Stream::getMark(&this->stream_);
  (this->token_).type = EOT;
  *(undefined1 **)
   &(this->token_).value.
    super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
    .super__Move_assign_alias<std::__cxx11::basic_string<char>,_double>.
    super__Copy_assign_alias<std::__cxx11::basic_string<char>,_double>.
    super__Move_ctor_alias<std::__cxx11::basic_string<char>,_double>.
    super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_double>.
    super__Variant_storage_alias<std::__cxx11::basic_string<char>,_double>._M_u =
       (undefined1 *)
       ((long)&(this->token_).value.
               super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
               .super__Move_assign_alias<std::__cxx11::basic_string<char>,_double>.
               super__Copy_assign_alias<std::__cxx11::basic_string<char>,_double>.
               super__Move_ctor_alias<std::__cxx11::basic_string<char>,_double>.
               super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_double> + 0x10);
  *(undefined8 *)
   ((long)&(this->token_).value.
           super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
           .super__Move_assign_alias<std::__cxx11::basic_string<char>,_double>.
           super__Copy_assign_alias<std::__cxx11::basic_string<char>,_double>.
           super__Move_ctor_alias<std::__cxx11::basic_string<char>,_double>.
           super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_double> + 8) = 0;
  *(undefined1 *)
   ((long)&(this->token_).value.
           super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
           .super__Move_assign_alias<std::__cxx11::basic_string<char>,_double>.
           super__Copy_assign_alias<std::__cxx11::basic_string<char>,_double>.
           super__Move_ctor_alias<std::__cxx11::basic_string<char>,_double>.
           super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_double> + 0x10) = 0;
  *(__index_type *)
   ((long)&(this->token_).value.
           super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
           .super__Move_assign_alias<std::__cxx11::basic_string<char>,_double>.
           super__Copy_assign_alias<std::__cxx11::basic_string<char>,_double>.
           super__Move_ctor_alias<std::__cxx11::basic_string<char>,_double>.
           super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_double> + 0x20) = '\0';
  (this->token_).mark = *pMVar1;
  nextToken(&TStack_48,this);
  std::__detail::__variant::
  _Variant_storage<false,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
  ::~_Variant_storage((_Variant_storage<false,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
                       *)&TStack_48.value);
  return;
}

Assistant:

Tokenizer::Tokenizer(std::istream& stream): stream_(stream), token_(stream_.getMark())
{
  nextToken();
}